

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::EnhancedLayouts::GLSLConstantIntegralExpressionTest::getVerificationSnippet_abi_cxx11_
          (string *__return_storage_ptr__,GLSLConstantIntegralExpressionTest *this,GLuint param_1,
          ProgramInterface *param_2,STAGES param_3)

{
  char local_58 [8];
  GLchar buffer [16];
  size_t position;
  allocator<char> local_2e;
  undefined1 local_2d;
  STAGES local_2c;
  ProgramInterface *pPStack_28;
  STAGES param_3_local;
  ProgramInterface *param_2_local;
  GLSLConstantIntegralExpressionTest *pGStack_18;
  GLuint param_1_local;
  GLSLConstantIntegralExpressionTest *this_local;
  string *verification;
  
  local_2d = 0;
  local_2c = param_3;
  pPStack_28 = param_2;
  param_2_local._4_4_ = param_1;
  pGStack_18 = this;
  this_local = (GLSLConstantIntegralExpressionTest *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "{\n        uint goku_sum = 0;\n        uint gohan_sum = 0;\n        uint goten_sum = 0;\n\n        for (uint i = 0u; i < goku.length(); ++i)\n        {\n            goku_sum += goku[i];\n        }\n\n        for (uint i = 0u; i < gohan.length(); ++i)\n        {\n            gohan_sum += gohan[i];\n        }\n\n        for (uint i = 0u; i < goten.length(); ++i)\n        {\n            goten_sum += goten[i];\n        }\n\n        if ( (1u != goku_sum)  &&\n             (EXPECTED_GOHAN_SUMu != gohan_sum) ||\n             (EXPECTED_GOTEN_SUMu != goten_sum) )\n        {\n            result = 0u;\n        }\n    }\n"
             ,&local_2e);
  std::allocator<char>::~allocator(&local_2e);
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  sprintf(local_58,"%d",(ulong)(uint)this->m_gohan_length);
  Utils::replaceToken("EXPECTED_GOHAN_SUM",(size_t *)(buffer + 8),local_58,__return_storage_ptr__);
  sprintf(local_58,"%d",(ulong)(uint)this->m_goten_length);
  Utils::replaceToken("EXPECTED_GOTEN_SUM",(size_t *)(buffer + 8),local_58,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string GLSLConstantIntegralExpressionTest::getVerificationSnippet(GLuint /* test_case_index */,
																	   Utils::ProgramInterface& /* program_interface */,
																	   Utils::Shader::STAGES /* stage */)
{
	std::string verification = "{\n"
							   "        uint goku_sum = 0;\n"
							   "        uint gohan_sum = 0;\n"
							   "        uint goten_sum = 0;\n"
							   "\n"
							   "        for (uint i = 0u; i < goku.length(); ++i)\n"
							   "        {\n"
							   "            goku_sum += goku[i];\n"
							   "        }\n"
							   "\n"
							   "        for (uint i = 0u; i < gohan.length(); ++i)\n"
							   "        {\n"
							   "            gohan_sum += gohan[i];\n"
							   "        }\n"
							   "\n"
							   "        for (uint i = 0u; i < goten.length(); ++i)\n"
							   "        {\n"
							   "            goten_sum += goten[i];\n"
							   "        }\n"
							   "\n"
							   "        if ( (1u != goku_sum)  &&\n"
							   "             (EXPECTED_GOHAN_SUMu != gohan_sum) ||\n"
							   "             (EXPECTED_GOTEN_SUMu != goten_sum) )\n"
							   "        {\n"
							   "            result = 0u;\n"
							   "        }\n"
							   "    }\n";

	size_t position = 0;
	GLchar buffer[16];

	sprintf(buffer, "%d", m_gohan_length);
	Utils::replaceToken("EXPECTED_GOHAN_SUM", position, buffer, verification);

	sprintf(buffer, "%d", m_goten_length);
	Utils::replaceToken("EXPECTED_GOTEN_SUM", position, buffer, verification);

	return verification;
}